

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O1

RK_S32 __thiscall
VpuApiLegacy::encoder_getstream(VpuApiLegacy *this,VpuCodecContext *ctx,EncoderOut_t *aEncOut)

{
  undefined8 uVar1;
  MPP_RET MVar2;
  ulong uVar3;
  RK_U8 *__dest;
  size_t __n;
  bool bVar4;
  MppPacket packet;
  RK_S32 is_intra;
  long local_50;
  undefined8 local_48;
  RK_S64 local_40;
  undefined8 local_38;
  
  packet = (MppPacket)0x0;
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","encoder_getstream");
  }
  MVar2 = (*this->mpi->encode_get_packet)(this->mpp_ctx,&packet);
  if (MVar2 == MPP_OK) {
    if (packet == (MppPacket)0x0) {
      aEncOut->size = 0;
      if (((byte)vpu_api_debug & 0x20) != 0) {
        _mpp_log_l(4,"vpu_api_legacy","get NULL packet, eos %d\n","encoder_getstream",this->mEosSet)
        ;
      }
      MVar2 = -(uint)(this->mEosSet != 0);
    }
    else {
      local_50 = mpp_packet_get_data();
      local_38 = mpp_packet_get_eos(packet);
      local_40 = mpp_packet_get_pts(packet);
      uVar3 = mpp_packet_get_length(packet);
      local_48 = mpp_packet_get_meta(packet);
      is_intra = 0;
      __n = 0;
      if (3 < uVar3) {
        __n = uVar3 - 4;
      }
      bVar4 = ctx->videoCoding == OMX_RK_VIDEO_CodingAVC;
      if (!bVar4) {
        __n = uVar3;
      }
      aEncOut->data = (RK_U8 *)0x0;
      if (__n != 0) {
        __dest = (RK_U8 *)mpp_osal_calloc("encoder_getstream",__n + 0x100f & 0xfffffffffffff000);
        aEncOut->data = __dest;
        if (__dest != (RK_U8 *)0x0) {
          memcpy(__dest,(void *)(local_50 + (ulong)bVar4 * 4),__n);
        }
      }
      mpp_meta_get_s32(local_48,0x6f696472,&is_intra);
      uVar1 = local_38;
      aEncOut->size = (RK_S32)__n;
      aEncOut->timeUs = local_40;
      aEncOut->keyFrame = is_intra;
      if (((byte)vpu_api_debug & 0x20) != 0) {
        _mpp_log_l(4,"vpu_api_legacy","get packet %p size %d pts %lld keyframe %d eos %d\n",
                   "encoder_getstream",packet,__n,local_40,is_intra,local_38);
      }
      this->mEosSet = (RK_U32)uVar1;
      mpp_packet_deinit(&packet);
      MVar2 = MPP_OK;
    }
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","encode_get_packet failed ret %d\n","encoder_getstream",MVar2);
  }
  if (((byte)vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","leave ret %d\n","encoder_getstream",MVar2);
  }
  return MVar2;
}

Assistant:

RK_S32 VpuApiLegacy::encoder_getstream(VpuCodecContext *ctx, EncoderOut_t *aEncOut)
{
    RK_S32 ret = 0;
    MppPacket packet = NULL;
    vpu_api_dbg_func("enter\n");

    ret = mpi->encode_get_packet(mpp_ctx, &packet);
    if (ret) {
        mpp_err_f("encode_get_packet failed ret %d\n", ret);
        goto FUNC_RET;
    }
    if (packet) {
        RK_U8 *src = (RK_U8 *)mpp_packet_get_data(packet);
        RK_U32 eos = mpp_packet_get_eos(packet);
        RK_S64 pts = mpp_packet_get_pts(packet);
        size_t length = mpp_packet_get_length(packet);
        MppMeta meta = mpp_packet_get_meta(packet);
        RK_S32 is_intra = 0;

        RK_U32 offset = 0;
        if (ctx->videoCoding == OMX_RK_VIDEO_CodingAVC) {
            offset = 4;
            length = (length > offset) ? (length - offset) : 0;
        }
        aEncOut->data = NULL;
        if (length > 0) {
            aEncOut->data = mpp_calloc(RK_U8, MPP_ALIGN(length + 16, SZ_4K));
            if (aEncOut->data)
                memcpy(aEncOut->data, src + offset, length);
        }

        mpp_meta_get_s32(meta, KEY_OUTPUT_INTRA, &is_intra);

        aEncOut->size = (RK_S32)length;
        aEncOut->timeUs = pts;
        aEncOut->keyFrame = is_intra;

        vpu_api_dbg_output("get packet %p size %d pts %lld keyframe %d eos %d\n",
                           packet, length, pts, aEncOut->keyFrame, eos);

        mEosSet = eos;
        mpp_packet_deinit(&packet);
    } else {
        aEncOut->size = 0;
        vpu_api_dbg_output("get NULL packet, eos %d\n", mEosSet);
        if (mEosSet)
            ret = -1;
    }

FUNC_RET:
    vpu_api_dbg_func("leave ret %d\n", ret);
    return ret;
}